

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZInterpolatedElement_*,_10>::Resize
          (TPZManVector<TPZInterpolatedElement_*,_10> *this,int64_t newsize,
          TPZInterpolatedElement **object)

{
  TPZInterpolatedElement **ppTVar1;
  undefined1 auVar2 [16];
  ostream *this_00;
  ulong uVar3;
  ulong uVar4;
  TPZInterpolatedElement **ppTVar5;
  undefined8 *in_RDX;
  long in_RSI;
  TPZManVector<TPZInterpolatedElement_*,_10> *in_RDI;
  TPZInterpolatedElement **newstore;
  int64_t realsize;
  int64_t i_2;
  int64_t i_1;
  int64_t i;
  long local_30;
  long local_28;
  long local_20;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNElements) {
    if ((in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNAlloc < in_RSI) {
      if (in_RSI < 0xb) {
        for (local_28 = 0; local_28 < (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNElements;
            local_28 = local_28 + 1) {
          in_RDI->fExtAlloc[local_28] =
               (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore[local_28];
        }
        for (; local_28 < in_RSI; local_28 = local_28 + 1) {
          in_RDI->fExtAlloc[local_28] = (TPZInterpolatedElement *)*in_RDX;
        }
        if (((in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore != in_RDI->fExtAlloc) &&
           (ppTVar5 = (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore,
           ppTVar5 != (TPZInterpolatedElement **)0x0)) {
          operator_delete__(ppTVar5);
        }
        (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore = in_RDI->fExtAlloc;
        (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNAlloc = 10;
      }
      else {
        uVar3 = ExpandSize(in_RDI,in_RSI);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar3;
        uVar4 = SUB168(auVar2 * ZEXT816(8),0);
        if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        ppTVar5 = (TPZInterpolatedElement **)operator_new__(uVar4);
        for (local_30 = 0; local_30 < (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNElements;
            local_30 = local_30 + 1) {
          ppTVar5[local_30] = (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore[local_30];
        }
        for (; local_30 < in_RSI; local_30 = local_30 + 1) {
          ppTVar5[local_30] = (TPZInterpolatedElement *)*in_RDX;
        }
        if (((in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore != in_RDI->fExtAlloc) &&
           (ppTVar1 = (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore,
           ppTVar1 != (TPZInterpolatedElement **)0x0)) {
          operator_delete__(ppTVar1);
        }
        (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore = ppTVar5;
        (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNAlloc = uVar3;
      }
    }
    else {
      for (local_20 = (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNElements; local_20 < in_RSI
          ; local_20 = local_20 + 1) {
        (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fStore[local_20] =
             (TPZInterpolatedElement *)*in_RDX;
      }
      (in_RDI->super_TPZVec<TPZInterpolatedElement_*>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}